

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O2

void __thiscall
datarate_test::(anonymous_namespace)::
DatarateTestSVC_BasicRateTargetingSVC3TL3SLExternalResizePattern2_Test::
~DatarateTestSVC_BasicRateTargetingSVC3TL3SLExternalResizePattern2_Test
          (DatarateTestSVC_BasicRateTargetingSVC3TL3SLExternalResizePattern2_Test *this)

{
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC3TL3SLExternalResizePattern2_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC3TL3SLExternalResizePattern2_Test
            ((DatarateTestSVC_BasicRateTargetingSVC3TL3SLExternalResizePattern2_Test *)
             (this + -0x18));
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC3TL3SLExternalResizePattern2) {
  BasicRateTargetingSVC3TL3SLExternalResizePattern2Test();
}